

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllTypes.cpp
# Opt level: O0

Type * slang::ast::EnumType::fromSyntax
                 (Compilation *comp,EnumTypeSyntax *syntax,ASTContext *context,
                 function_ref<void_(const_slang::ast::Symbol_&)> insertCB)

{
  SourceRange range;
  SourceRange range_00;
  SourceRange sourceRange;
  optional<int> value;
  optional<int> value_00;
  SourceRange range_01;
  SourceRange range_02;
  SourceRange range_03;
  string_view sVar1;
  bool bVar2;
  size_type sVar3;
  EnumValueSymbol *type;
  EnumValueSymbol *in_RDX;
  SyntaxNode *in_RSI;
  _Optional_payload_base<int> in_RDI;
  SourceRange SVar4;
  SourceRange SVar5;
  EnumValueSymbol *ev_2;
  bool down;
  EnumValueSymbol *ev_1;
  int32_t index;
  EvaluatedDimension dim;
  EnumValueSymbol *ev;
  DeclaratorSyntax *member;
  const_iterator __end2;
  const_iterator __begin2;
  SeparatedSyntaxList<slang::syntax::DeclaratorSyntax> *__range2;
  anon_class_80_10_279d319d inferValue;
  anon_class_56_7_20ba5b4c setInitializer;
  anon_class_16_2_bd45431b checkValue;
  SmallMap<slang::SVInt,_slang::SourceLocation,_8UL,_std::pair<const_slang::SVInt,_slang::SourceLocation>,_slang::detail::hashing::StackAllocator<std::pair<const_slang::SVInt,_slang::SourceLocation>,_192UL,_16UL>_>
  usedValues;
  Type *resultType;
  EnumType *enumType;
  bool first;
  SourceRange previousRange;
  ConstantValue previous;
  SVInt one;
  SVInt allOnes;
  bitwidth_t bitWidth;
  Type *cb;
  Type *base;
  undefined7 in_stack_fffffffffffffa98;
  undefined1 in_stack_fffffffffffffa9f;
  Type *in_stack_fffffffffffffaa0;
  EnumType *pEVar6;
  Type *in_stack_fffffffffffffaa8;
  SourceLocation in_stack_fffffffffffffab0;
  SourceLocation this;
  SourceLocation in_stack_fffffffffffffab8;
  _Storage<int,_true> in_stack_fffffffffffffac0;
  DiagCode in_stack_fffffffffffffac4;
  undefined4 in_stack_fffffffffffffac8;
  _Storage<int,_true> in_stack_fffffffffffffacc;
  undefined4 in_stack_fffffffffffffad0;
  DiagCode in_stack_fffffffffffffad4;
  int local_520;
  EnumValueSymbol *in_stack_fffffffffffffae8;
  SourceLocation in_stack_fffffffffffffaf0;
  SourceLocation in_stack_fffffffffffffaf8;
  _Optional_payload_base<int> in_stack_fffffffffffffb00;
  EnumType *local_408;
  EqualsValueClauseSyntax *initializer;
  EnumValueSymbol *in_stack_fffffffffffffc58;
  SourceLocation in_stack_fffffffffffffc60;
  int local_354;
  EnumValueSymbol *in_stack_fffffffffffffcd8;
  DimensionKind in_stack_fffffffffffffce0;
  int in_stack_fffffffffffffce4;
  int iVar7;
  int in_stack_fffffffffffffce8;
  undefined1 in_stack_fffffffffffffcec [12];
  optional<int> local_2d0;
  EnumValueSymbol *local_2c8;
  DeclaratorSyntax *local_2c0;
  const_iterator local_2b8;
  const_iterator local_2a8;
  SyntaxNode **local_298;
  undefined1 *local_290;
  bitwidth_t *local_288;
  EnumType **local_280;
  undefined1 *local_278;
  EnumValueSymbol *local_270;
  EnumType **local_268;
  undefined1 *local_260;
  undefined1 *local_258;
  undefined1 *local_250;
  undefined1 **local_248;
  undefined1 *local_240;
  undefined1 *local_238;
  undefined1 *local_230;
  EnumValueSymbol *local_228;
  bitwidth_t *local_220;
  EnumType **local_218;
  undefined1 **local_210;
  undefined1 *local_208;
  EnumValueSymbol *local_200;
  undefined1 local_1f8 [264];
  EnumType *local_f0;
  string_view local_e8;
  SourceLocation local_d8;
  EnumType *local_d0;
  undefined1 local_c1;
  undefined1 local_c0 [16];
  undefined1 local_b0 [40];
  undefined1 local_88 [32];
  undefined1 local_68 [16];
  Token local_58;
  SourceLocation local_48;
  undefined4 local_40;
  bitwidth_t local_3c;
  EnumType *local_38;
  EnumType *local_30;
  EnumValueSymbol *local_28;
  SyntaxNode *local_20;
  _Optional_payload_base<int> local_18;
  
  local_3c = 0x20;
  local_28 = in_RDX;
  local_20 = in_RSI;
  local_18 = in_RDI;
  if (in_RSI[1].previewNode == (SyntaxNode *)0x0) {
    local_38 = (EnumType *)Compilation::getIntType((Compilation *)in_RDI);
    local_30 = local_38;
    local_3c = Type::getBitWidth(in_stack_fffffffffffffaa8);
  }
  else {
    local_30 = (EnumType *)
               Compilation::getType
                         ((Compilation *)in_stack_fffffffffffffab0,
                          (DataTypeSyntax *)in_stack_fffffffffffffaa8,
                          (ASTContext *)in_stack_fffffffffffffaa0,
                          (Type *)CONCAT17(in_stack_fffffffffffffa9f,in_stack_fffffffffffffa98));
    local_38 = (EnumType *)Type::getCanonicalType(in_stack_fffffffffffffaa0);
    bVar2 = Type::isError((Type *)0x4ceba6);
    if (!bVar2) {
      bVar2 = Type::isSimpleBitVector(in_stack_fffffffffffffaa8);
      if ((bVar2) || ((local_20[1].previewNode)->kind != NamedType)) {
        local_3c = Type::getBitWidth(in_stack_fffffffffffffaa8);
      }
      else {
        local_40 = 0xf0009;
        in_stack_fffffffffffffc58 = local_28;
        local_58 = slang::syntax::SyntaxNode::getFirstToken
                             ((SyntaxNode *)
                              CONCAT44(in_stack_fffffffffffffad4,in_stack_fffffffffffffad0));
        local_48 = parsing::Token::location(&local_58);
        ASTContext::addDiag((ASTContext *)in_stack_fffffffffffffab0,in_stack_fffffffffffffac4,
                            in_stack_fffffffffffffab8);
        ast::operator<<((Diagnostic *)in_stack_fffffffffffffaf0,(Type *)in_stack_fffffffffffffae8);
        local_38 = (EnumType *)Compilation::getErrorType((Compilation *)local_18);
      }
    }
  }
  Type::isSigned(in_stack_fffffffffffffaa0);
  initializer = (EqualsValueClauseSyntax *)local_68;
  SVInt::SVInt((SVInt *)in_stack_fffffffffffffab0,
               (bitwidth_t)((ulong)in_stack_fffffffffffffaa8 >> 0x20),
               (uint64_t)in_stack_fffffffffffffaa0,(bool)in_stack_fffffffffffffa9f);
  SVInt::setAllOnes((SVInt *)in_stack_fffffffffffffab0);
  Type::isSigned(in_stack_fffffffffffffaa0);
  SVInt::SVInt((SVInt *)in_stack_fffffffffffffab0,
               (bitwidth_t)((ulong)in_stack_fffffffffffffaa8 >> 0x20),
               (uint64_t)in_stack_fffffffffffffaa0,(bool)in_stack_fffffffffffffa9f);
  slang::ConstantValue::ConstantValue((ConstantValue *)0x4ced33);
  SourceRange::SourceRange((SourceRange *)in_stack_fffffffffffffaa0);
  local_c1 = 1;
  local_d8 = parsing::Token::location((Token *)(local_20 + 1));
  local_d0 = BumpAllocator::
             emplace<slang::ast::EnumType,slang::ast::Compilation&,slang::SourceLocation,slang::ast::Type_const&,slang::ast::ASTContext_const&>
                       ((BumpAllocator *)
                        CONCAT44(in_stack_fffffffffffffac4,in_stack_fffffffffffffac0._M_value),
                        (Compilation *)in_stack_fffffffffffffab8,
                        (SourceLocation *)in_stack_fffffffffffffab0,in_stack_fffffffffffffaa8,
                        (ASTContext *)in_stack_fffffffffffffaa0);
  Symbol::setSyntax((Symbol *)local_d0,local_20);
  sVar1._M_str = local_e8._M_str;
  sVar1._M_len = local_e8._M_len;
  if ((local_20->parent != (SyntaxNode *)0x0) &&
     (local_e8 = sVar1, local_20->parent->kind == TypedefDeclaration)) {
    slang::syntax::SyntaxNode::as<slang::syntax::TypedefDeclarationSyntax>(local_20->parent);
    local_e8 = parsing::Token::valueText((Token *)in_stack_fffffffffffffab0);
    (local_d0->super_IntegralType).super_Type.super_Symbol.name = local_e8;
  }
  bVar2 = Type::isError((Type *)0x4ceed5);
  if (bVar2) {
    local_408 = local_38;
  }
  else {
    local_408 = local_d0;
  }
  local_f0 = local_408;
  SmallMap<slang::SVInt,_slang::SourceLocation,_8UL,_std::pair<const_slang::SVInt,_slang::SourceLocation>,_slang::detail::hashing::StackAllocator<std::pair<const_slang::SVInt,_slang::SourceLocation>,_192UL,_16UL>_>
  ::SmallMap((SmallMap<slang::SVInt,_slang::SourceLocation,_8UL,_std::pair<const_slang::SVInt,_slang::SourceLocation>,_slang::detail::hashing::StackAllocator<std::pair<const_slang::SVInt,_slang::SourceLocation>,_192UL,_16UL>_>
              *)in_stack_fffffffffffffab0);
  local_208 = local_1f8;
  local_200 = local_28;
  local_290 = &local_c1;
  local_278 = local_b0;
  local_260 = local_c0;
  local_228 = local_28;
  local_288 = &local_3c;
  local_268 = &local_30;
  local_248 = &local_208;
  local_280 = &local_38;
  local_270 = local_28;
  local_258 = local_68;
  local_250 = local_88;
  local_298 = &local_20[2].previewNode;
  local_240 = local_290;
  local_238 = local_278;
  local_230 = local_260;
  local_220 = local_288;
  local_218 = local_268;
  local_210 = local_248;
  local_2a8 = slang::syntax::SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>::begin
                        ((SeparatedSyntaxList<slang::syntax::DeclaratorSyntax> *)0x4cf04d);
  local_2b8 = slang::syntax::SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>::end
                        ((SeparatedSyntaxList<slang::syntax::DeclaratorSyntax> *)0x4cf08c);
  SVar5.endLoc = in_stack_fffffffffffffab0;
  SVar5.startLoc = in_stack_fffffffffffffab8;
  SVar4.endLoc = in_stack_fffffffffffffaf0;
  SVar4.startLoc = in_stack_fffffffffffffaf8;
  local_354 = in_stack_fffffffffffffce4;
  while( true ) {
    bVar2 = operator==<slang::syntax::SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>::iterator_base<const_slang::syntax::DeclaratorSyntax_*>_>
                      ((self_type *)in_stack_fffffffffffffaa0,
                       (iterator_base<const_slang::syntax::DeclaratorSyntax_*> *)
                       CONCAT17(in_stack_fffffffffffffa9f,in_stack_fffffffffffffa98));
    this = SVar5.endLoc;
    if (((bVar2 ^ 0xffU) & 1) == 0) break;
    local_2c0 = iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>::iterator_base<const_slang::syntax::DeclaratorSyntax_*>,_false>
                ::operator*((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>::iterator_base<const_slang::syntax::DeclaratorSyntax_*>,_false>
                             *)0x4cf0fb);
    bVar2 = std::span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL>::empty
                      ((span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL> *)
                       0x4cf12a);
    if (bVar2) {
      std::optional<int>::optional(&local_2d0);
      local_2c8 = EnumValueSymbol::fromSyntax
                            ((Compilation *)SVar4.startLoc,(DeclaratorSyntax *)SVar4.endLoc,
                             (Type *)in_stack_fffffffffffffae8,
                             (optional<int>)in_stack_fffffffffffffb00);
      Scope::addMember((Scope *)in_stack_fffffffffffffaa0,
                       (Symbol *)CONCAT17(in_stack_fffffffffffffa9f,in_stack_fffffffffffffa98));
      function_ref<void_(const_slang::ast::Symbol_&)>::operator()
                ((function_ref<void_(const_slang::ast::Symbol_&)> *)in_stack_fffffffffffffaa0,
                 (Symbol *)CONCAT17(in_stack_fffffffffffffa9f,in_stack_fffffffffffffa98));
      if (local_2c0->initializer == (EqualsValueClauseSyntax *)0x0) {
        slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)SVar4.endLoc);
        range_01._4_12_ = in_stack_fffffffffffffcec;
        range_01.startLoc._0_4_ = in_stack_fffffffffffffce8;
        fromSyntax::anon_class_80_10_279d319d::operator()
                  ((anon_class_80_10_279d319d *)CONCAT44(local_354,in_stack_fffffffffffffce0),
                   in_stack_fffffffffffffcd8,range_01);
        iVar7 = local_354;
      }
      else {
        fromSyntax::anon_class_56_7_20ba5b4c::operator()
                  ((anon_class_56_7_20ba5b4c *)in_stack_fffffffffffffc60,in_stack_fffffffffffffc58,
                   initializer);
        iVar7 = local_354;
      }
    }
    else {
      sVar3 = std::span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL>::size
                        ((span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL> *)
                         0x4cf2d0);
      if (1 < sVar3) {
        slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)SVar4.endLoc);
        sourceRange.startLoc._4_2_ = in_stack_fffffffffffffac4.subsystem;
        sourceRange.startLoc._6_2_ = in_stack_fffffffffffffac4.code;
        sourceRange.startLoc._0_4_ = in_stack_fffffffffffffac0._M_value;
        sourceRange.endLoc._0_4_ = in_stack_fffffffffffffac8;
        sourceRange.endLoc._4_4_ = in_stack_fffffffffffffacc._M_value;
        ASTContext::addDiag((ASTContext *)SVar5.startLoc,in_stack_fffffffffffffad4,sourceRange);
      }
      std::span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL>::operator[]
                (&(local_2c0->dimensions).
                  super_span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL>,0);
      ASTContext::evalUnpackedDimension
                ((ASTContext *)in_stack_fffffffffffffaa0,
                 (VariableDimensionSyntax *)
                 CONCAT17(in_stack_fffffffffffffa9f,in_stack_fffffffffffffa98));
      bVar2 = EvaluatedDimension::isRange((EvaluatedDimension *)&stack0xfffffffffffffce0);
      iVar7 = local_354;
      if (bVar2) {
        std::optional<int>::optional<int_&,_true>
                  ((optional<int> *)in_stack_fffffffffffffaa0,
                   (int *)CONCAT17(in_stack_fffffffffffffa9f,in_stack_fffffffffffffa98));
        std::span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL>::operator[]
                  (&(local_2c0->dimensions).
                    super_span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL>,0);
        slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)SVar4.endLoc);
        value.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>.
        _4_4_ = in_stack_fffffffffffffad0;
        value.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>.
        _M_payload._M_value = in_stack_fffffffffffffacc._M_value;
        range.endLoc._0_4_ = in_stack_fffffffffffffac0._M_value;
        range.startLoc = SVar5.startLoc;
        range.endLoc._4_2_ = in_stack_fffffffffffffac4.subsystem;
        range.endLoc._6_2_ = in_stack_fffffffffffffac4.code;
        bVar2 = ASTContext::requirePositive((ASTContext *)SVar5.endLoc,value,range);
        iVar7 = local_354;
        if (bVar2) {
          std::optional<int>::optional<int_&,_true>
                    ((optional<int> *)in_stack_fffffffffffffaa0,
                     (int *)CONCAT17(in_stack_fffffffffffffa9f,in_stack_fffffffffffffa98));
          std::span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL>::operator[]
                    (&(local_2c0->dimensions).
                      super_span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL>,0
                    );
          slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)SVar4.endLoc);
          value_00.super__Optional_base<int,_true,_true>._M_payload.
          super__Optional_payload_base<int>._4_4_ = in_stack_fffffffffffffad0;
          value_00.super__Optional_base<int,_true,_true>._M_payload.
          super__Optional_payload_base<int>._M_payload._M_value = in_stack_fffffffffffffacc._M_value
          ;
          range_00.endLoc._0_4_ = in_stack_fffffffffffffac0._M_value;
          range_00.startLoc = SVar5.startLoc;
          range_00.endLoc._4_2_ = in_stack_fffffffffffffac4.subsystem;
          range_00.endLoc._6_2_ = in_stack_fffffffffffffac4.code;
          bVar2 = ASTContext::requirePositive((ASTContext *)SVar5.endLoc,value_00,range_00);
          iVar7 = local_354;
          if (bVar2) {
            std::span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL>::operator[]
                      (&(local_2c0->dimensions).
                        super_span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL>
                       ,0);
            checkEnumRange((ASTContext *)
                           CONCAT44(in_stack_fffffffffffffac4,in_stack_fffffffffffffac0._M_value),
                           (VariableDimensionSyntax *)SVar5.startLoc);
            in_stack_fffffffffffffb00 = local_18;
            iVar7 = local_354;
            std::optional<int>::optional<int_&,_true>
                      ((optional<int> *)in_stack_fffffffffffffaa0,
                       (int *)CONCAT17(in_stack_fffffffffffffa9f,in_stack_fffffffffffffa98));
            type = EnumValueSymbol::fromSyntax
                             ((Compilation *)SVar4.startLoc,(DeclaratorSyntax *)SVar4.endLoc,
                              (Type *)in_stack_fffffffffffffae8,
                              (optional<int>)in_stack_fffffffffffffb00);
            Scope::addMember((Scope *)in_stack_fffffffffffffaa0,
                             (Symbol *)CONCAT17(in_stack_fffffffffffffa9f,in_stack_fffffffffffffa98)
                            );
            function_ref<void_(const_slang::ast::Symbol_&)>::operator()
                      ((function_ref<void_(const_slang::ast::Symbol_&)> *)in_stack_fffffffffffffaa0,
                       (Symbol *)CONCAT17(in_stack_fffffffffffffa9f,in_stack_fffffffffffffa98));
            if (local_2c0->initializer == (EqualsValueClauseSyntax *)0x0) {
              SVar4 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)SVar4.endLoc);
              range_02._4_12_ = in_stack_fffffffffffffcec;
              range_02.startLoc._0_4_ = in_stack_fffffffffffffce8;
              fromSyntax::anon_class_80_10_279d319d::operator()
                        ((anon_class_80_10_279d319d *)CONCAT44(iVar7,in_stack_fffffffffffffce0),
                         in_stack_fffffffffffffcd8,range_02);
            }
            else {
              fromSyntax::anon_class_56_7_20ba5b4c::operator()
                        ((anon_class_56_7_20ba5b4c *)in_stack_fffffffffffffc60,
                         in_stack_fffffffffffffc58,initializer);
              type = in_stack_fffffffffffffae8;
            }
            bVar2 = ConstantRange::isLittleEndian((ConstantRange *)&stack0xfffffffffffffce4);
            while (in_stack_fffffffffffffae8 = type, local_354 != in_stack_fffffffffffffce8) {
              if (bVar2) {
                local_520 = local_354 + -1;
              }
              else {
                local_520 = local_354 + 1;
              }
              local_354 = local_520;
              in_stack_fffffffffffffac0 = local_18._M_payload;
              in_stack_fffffffffffffac4 = local_18._4_4_;
              in_stack_fffffffffffffac8 = SUB84(local_2c0,0);
              in_stack_fffffffffffffacc._M_value = (int)((ulong)local_2c0 >> 0x20);
              in_stack_fffffffffffffad0 = SUB84(local_f0,0);
              in_stack_fffffffffffffad4 = SUB84((ulong)local_f0 >> 0x20,0);
              std::optional<int>::optional<int_&,_true>
                        ((optional<int> *)in_stack_fffffffffffffaa0,
                         (int *)CONCAT17(in_stack_fffffffffffffa9f,in_stack_fffffffffffffa98));
              EnumValueSymbol::fromSyntax
                        ((Compilation *)SVar4.startLoc,(DeclaratorSyntax *)SVar4.endLoc,(Type *)type
                         ,(optional<int>)in_stack_fffffffffffffb00);
              Scope::addMember((Scope *)in_stack_fffffffffffffaa0,
                               (Symbol *)
                               CONCAT17(in_stack_fffffffffffffa9f,in_stack_fffffffffffffa98));
              function_ref<void_(const_slang::ast::Symbol_&)>::operator()
                        ((function_ref<void_(const_slang::ast::Symbol_&)> *)
                         in_stack_fffffffffffffaa0,
                         (Symbol *)CONCAT17(in_stack_fffffffffffffa9f,in_stack_fffffffffffffa98));
              SVar5 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)SVar4.endLoc);
              in_stack_fffffffffffffc60 = SVar5.startLoc;
              range_03._4_12_ = in_stack_fffffffffffffcec;
              range_03.startLoc._0_4_ = in_stack_fffffffffffffce8;
              fromSyntax::anon_class_80_10_279d319d::operator()
                        ((anon_class_80_10_279d319d *)CONCAT44(iVar7,in_stack_fffffffffffffce0),
                         in_stack_fffffffffffffcd8,range_03);
            }
          }
        }
      }
    }
    iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>::iterator_base<const_slang::syntax::DeclaratorSyntax_*>,_false>
    ::
    operator++<slang::syntax::SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>::iterator_base<const_slang::syntax::DeclaratorSyntax_*>_>
              ((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>::iterator_base<const_slang::syntax::DeclaratorSyntax_*>,_false>
                *)in_stack_fffffffffffffaa0);
    local_354 = iVar7;
  }
  pEVar6 = local_f0;
  SmallMap<slang::SVInt,_slang::SourceLocation,_8UL,_std::pair<const_slang::SVInt,_slang::SourceLocation>,_slang::detail::hashing::StackAllocator<std::pair<const_slang::SVInt,_slang::SourceLocation>,_192UL,_16UL>_>
  ::~SmallMap((SmallMap<slang::SVInt,_slang::SourceLocation,_8UL,_std::pair<const_slang::SVInt,_slang::SourceLocation>,_slang::detail::hashing::StackAllocator<std::pair<const_slang::SVInt,_slang::SourceLocation>,_192UL,_16UL>_>
               *)0x4cf850);
  slang::ConstantValue::~ConstantValue((ConstantValue *)0x4cf85d);
  SVInt::~SVInt((SVInt *)this);
  SVInt::~SVInt((SVInt *)this);
  return (Type *)pEVar6;
}

Assistant:

const Type& EnumType::fromSyntax(Compilation& comp, const EnumTypeSyntax& syntax,
                                 const ASTContext& context,
                                 function_ref<void(const Symbol&)> insertCB) {
    const Type* base;
    const Type* cb;
    bitwidth_t bitWidth = 32;

    if (!syntax.baseType) {
        // If no explicit base type is specified we default to an int.
        base = &comp.getIntType();
        cb = base;
        bitWidth = cb->getBitWidth();
    }
    else {
        base = &comp.getType(*syntax.baseType, context);
        cb = &base->getCanonicalType();
        if (!cb->isError()) {
            // Error if the named type is invalid for an enum base type. Other invalid types
            // will have been diagnosed already by the parser.
            if (!cb->isSimpleBitVector() && syntax.baseType->kind == SyntaxKind::NamedType) {
                context.addDiag(diag::InvalidEnumBase, syntax.baseType->getFirstToken().location())
                    << *base;
                cb = &comp.getErrorType();
            }
            else {
                bitWidth = cb->getBitWidth();
                SLANG_ASSERT(bitWidth);
            }
        }
    }

    SVInt allOnes(bitWidth, 0, cb->isSigned());
    allOnes.setAllOnes();

    SVInt one(bitWidth, 1, cb->isSigned());
    ConstantValue previous;
    SourceRange previousRange;
    bool first = true;

    auto enumType = comp.emplace<EnumType>(comp, syntax.keyword.location(), *base, context);
    enumType->setSyntax(syntax);

    // If this enum is inside a typedef we want to save the name here so that
    // when printing the types of our enum values we can refer back to this.
    if (syntax.parent && syntax.parent->kind == SyntaxKind::TypedefDeclaration)
        enumType->name = syntax.parent->as<TypedefDeclarationSyntax>().name.valueText();

    auto resultType = cb->isError() ? cb : enumType;

    // Enum values must be unique; this set and lambda are used to check that.
    SmallMap<SVInt, SourceLocation, 8> usedValues;
    auto checkValue = [&usedValues, &context](const ConstantValue& cv, SourceLocation loc) {
        if (!cv)
            return;

        auto& value = cv.integer();
        auto pair = usedValues.emplace(value, loc);
        if (!pair.second) {
            auto& diag = context.addDiag(diag::EnumValueDuplicate, loc) << value;
            diag.addNote(diag::NotePreviousDefinition, pair.first->second);
        }
    };

    // For enumerands that have an initializer, set it up appropriately.
    auto setInitializer = [&](EnumValueSymbol& ev, const EqualsValueClauseSyntax& initializer) {
        // Clear our previous state in case there's an error and we need to exit early.
        first = false;
        previous = nullptr;

        // Create the initializer expression.
        ev.setInitializerSyntax(*initializer.expr, initializer.equals.location());
        auto initExpr = ev.getInitializer();
        SLANG_ASSERT(initExpr);
        if (initExpr->bad())
            return;

        // Drill down to the original initializer before any conversions are applied.
        initExpr = &initExpr->unwrapImplicitConversions();
        previousRange = initExpr->sourceRange;

        // [6.19] says that the initializer for an enum value must be an integer expression that
        // does not truncate any bits. Furthermore, if a sized literal constant is used, it must
        // be sized exactly to the size of the enum base type.
        auto& rt = *initExpr->type;
        if (!rt.isIntegral()) {
            context.addDiag(diag::ValueMustBeIntegral, previousRange);
            return;
        }

        if (bitWidth != rt.getBitWidth() && initExpr->kind == ExpressionKind::IntegerLiteral &&
            !initExpr->as<IntegerLiteral>().isDeclaredUnsized) {
            auto& diag = context.addDiag(diag::EnumValueSizeMismatch, previousRange);
            diag << rt.getBitWidth() << bitWidth;
        }

        ev.getValue();
        if (!initExpr->constant)
            return;

        // An enumerated name with x or z assignments assigned to an enum with no explicit data type
        // or an explicit 2-state declaration shall be a syntax error.
        auto& value = initExpr->constant->integer();
        if (!base->isFourState() && value.hasUnknown()) {
            context.addDiag(diag::EnumValueUnknownBits, previousRange) << value << *base;
            return;
        }

        // Any enumeration encoding value that is outside the representable range of the enum base
        // type shall be an error. For an unsigned base type, this occurs if the cast truncates the
        // value and any of the discarded bits are nonzero. For a signed base type, this occurs if
        // the cast truncates the value and any of the discarded bits are not equal to the sign bit
        // of the result.
        if (value.getBitWidth() > bitWidth) {
            bool good = true;
            if (!base->isSigned()) {
                good = exactlyEqual(value[int32_t(bitWidth)], logic_t(false)) &&
                       value.isSignExtendedFrom(bitWidth);
            }
            else {
                good = value.isSignExtendedFrom(bitWidth - 1);
            }

            if (!good) {
                context.addDiag(diag::EnumValueOutOfRange, previousRange) << value << *base;
                return;
            }
        }

        previous = ev.getValue();
        checkValue(previous, previousRange.start());
    };

    // For enumerands that have no initializer, infer the value via this function.
    auto inferValue = [&](EnumValueSymbol& ev, SourceRange range) {
        auto loc = range.start();
        SVInt value;
        if (first) {
            value = SVInt(bitWidth, 0, cb->isSigned());
            first = false;
        }
        else if (!previous) {
            return;
        }
        else {
            auto& prev = previous.integer();
            if (prev.hasUnknown()) {
                auto& diag = context.addDiag(diag::EnumIncrementUnknown, loc);
                diag << prev << *base << previousRange;
                previous = nullptr;
                return;
            }
            else if (prev == allOnes) {
                auto& diag = context.addDiag(diag::EnumValueOverflow, loc);
                diag << prev << *base << previousRange;
                previous = nullptr;
                return;
            }

            value = prev + one;
        }

        checkValue(value, loc);

        ev.setValue(value);
        previous = std::move(value);
        previousRange = range;
    };

    for (auto member : syntax.members) {
        if (member->dimensions.empty()) {
            auto& ev = EnumValueSymbol::fromSyntax(comp, *member, *resultType, std::nullopt);
            enumType->addMember(ev);
            insertCB(ev);

            if (member->initializer)
                setInitializer(ev, *member->initializer);
            else
                inferValue(ev, member->sourceRange());
        }
        else {
            if (member->dimensions.size() > 1) {
                context.addDiag(diag::EnumRangeMultiDimensional, member->dimensions.sourceRange());
            }

            auto dim = context.evalUnpackedDimension(*member->dimensions[0]);
            if (!dim.isRange())
                continue;

            // Range must be positive.
            if (!context.requirePositive(std::optional(dim.range.left),
                                         member->dimensions[0]->sourceRange()) ||
                !context.requirePositive(std::optional(dim.range.right),
                                         member->dimensions[0]->sourceRange())) {
                continue;
            }

            // Enum ranges must be integer literals.
            checkEnumRange(context, *member->dimensions[0]);

            // Set up the first element using the initializer. All other elements (if there are any)
            // don't get the initializer.
            int32_t index = dim.range.left;
            {
                auto& ev = EnumValueSymbol::fromSyntax(comp, *member, *resultType, index);
                enumType->addMember(ev);
                insertCB(ev);

                if (member->initializer)
                    setInitializer(ev, *member->initializer);
                else
                    inferValue(ev, member->sourceRange());
            }

            bool down = dim.range.isLittleEndian();
            while (index != dim.range.right) {
                index = down ? index - 1 : index + 1;

                auto& ev = EnumValueSymbol::fromSyntax(comp, *member, *resultType, index);
                enumType->addMember(ev);
                insertCB(ev);

                inferValue(ev, member->sourceRange());
            }
        }
    }

    return *resultType;
}